

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O0

void __thiscall QMenuPrivate::~QMenuPrivate(QMenuPrivate *this)

{
  void *pvVar1;
  bool bVar2;
  QObject *pQVar3;
  undefined8 *in_RDI;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__QMenuPrivate_00d18078;
  pvVar1 = (void *)in_RDI[0x55];
  if (pvVar1 != (void *)0x0) {
    QMenuScroller::~QMenuScroller((QMenuScroller *)0x652b61);
    operator_delete(pvVar1,0xc);
  }
  bVar2 = QPointer<QPlatformMenu>::isNull((QPointer<QPlatformMenu> *)0x652b81);
  if (!bVar2) {
    QPointer<QPlatformMenu>::operator->((QPointer<QPlatformMenu> *)0x652b96);
    pQVar3 = QObject::parent((QObject *)0x652b9e);
    if ((pQVar3 == (QObject *)0x0) &&
       (in_stack_ffffffffffffffe0 =
             (QWidgetPrivate *)QPointer<QPlatformMenu>::data((QPointer<QPlatformMenu> *)0x652bb5),
       in_stack_ffffffffffffffe0 != (QWidgetPrivate *)0x0)) {
      (**(code **)(*(long *)in_stack_ffffffffffffffe0 + 0x20))();
    }
  }
  QPointer<QScreen>::~QPointer((QPointer<QScreen> *)0x652bde);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x652bef);
  QPointer<QAction>::~QPointer((QPointer<QAction> *)0x652c00);
  QPointer<QPlatformMenu>::~QPointer((QPointer<QPlatformMenu> *)0x652c11);
  QPointer<QAction>::~QPointer((QPointer<QAction> *)0x652c22);
  QMenuSloppyState::~QMenuSloppyState((QMenuSloppyState *)in_stack_ffffffffffffffe0);
  QPointer<QTornOffMenu>::~QPointer((QPointer<QTornOffMenu> *)0x652c44);
  QMenuCaused::~QMenuCaused((QMenuCaused *)in_stack_ffffffffffffffe0);
  QPointer<QMenu>::~QPointer((QPointer<QMenu> *)0x652c66);
  QBasicTimer::~QBasicTimer((QBasicTimer *)in_stack_ffffffffffffffe0);
  QString::~QString((QString *)0x652c88);
  QPointer<QAction>::~QPointer((QPointer<QAction> *)0x652c99);
  DelayState::~DelayState((DelayState *)0x652caa);
  QHash<QAction_*,_QWidget_*>::~QHash((QHash<QAction_*,_QWidget_*> *)in_stack_ffffffffffffffe0);
  QList<QRect>::~QList((QList<QRect> *)0x652ccc);
  QWidgetPrivate::~QWidgetPrivate(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

~QMenuPrivate()
    {
        delete scroll;
        if (!platformMenu.isNull() && !platformMenu->parent())
            delete platformMenu.data();
    }